

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_data_converter_process_pcm_frames__channels_only
                    (ma_data_converter *pConverter,void *pFramesIn,ma_uint64 *pFrameCountIn,
                    void *pFramesOut,ma_uint64 *pFrameCountOut)

{
  ma_uint32 mVar1;
  ma_result mVar2;
  ma_uint32 mVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  ma_uint64 local_20b8;
  undefined1 local_20a8 [4];
  ma_uint32 tempBufferInCap;
  ma_uint8 pTempBufferIn [4096];
  ma_uint64 frameCountThisIteration;
  void *pFramesOutThisIteration;
  void *pFramesInThisIteration;
  undefined1 local_1088 [4];
  ma_uint32 tempBufferOutCap;
  ma_uint8 pTempBufferOut [4096];
  ulong local_80;
  ma_uint64 framesProcessed;
  ma_uint64 frameCount;
  ma_uint64 frameCountOut;
  ma_uint64 frameCountIn;
  ma_result result;
  ma_uint64 *pFrameCountOut_local;
  void *pFramesOut_local;
  ma_uint64 *pFrameCountIn_local;
  void *pFramesIn_local;
  ma_data_converter *pConverter_local;
  
  if (pConverter == (ma_data_converter *)0x0) {
    __assert_fail("pConverter != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                  ,0x87aa,
                  "ma_result ma_data_converter_process_pcm_frames__channels_only(ma_data_converter *, const void *, ma_uint64 *, void *, ma_uint64 *)"
                 );
  }
  frameCountOut = 0;
  if (pFrameCountIn != (ma_uint64 *)0x0) {
    frameCountOut = *pFrameCountIn;
  }
  frameCount = 0;
  if (pFrameCountOut != (ma_uint64 *)0x0) {
    frameCount = *pFrameCountOut;
  }
  if (frameCountOut < frameCount) {
    local_20b8 = frameCountOut;
  }
  else {
    local_20b8 = frameCount;
  }
  if (((pConverter->field_0x2768 & 1) == 0) && (((byte)pConverter->field_0x2768 >> 1 & 1) == 0)) {
    mVar2 = ma_channel_converter_process_pcm_frames
                      (&pConverter->channelConverter,pFramesOut,pFramesIn,local_20b8);
    if (mVar2 != 0) {
      return mVar2;
    }
  }
  else {
    for (local_80 = 0; local_80 < local_20b8; local_80 = pTempBufferIn._4088_8_ + local_80) {
      mVar1 = (pConverter->channelConverter).channelsOut;
      mVar3 = ma_get_bytes_per_sample((pConverter->channelConverter).format);
      uVar4 = SUB164((ZEXT816(0) << 0x40 | ZEXT816(0x1000)) / ZEXT416(mVar3 * mVar1),0);
      if (pFramesIn == (void *)0x0) {
        pFramesOutThisIteration = (void *)0x0;
      }
      else {
        mVar1 = (pConverter->config).channelsIn;
        mVar3 = ma_get_bytes_per_sample((pConverter->config).formatIn);
        pFramesOutThisIteration = (void *)((long)pFramesIn + local_80 * (mVar3 * mVar1));
      }
      if (pFramesOut == (void *)0x0) {
        frameCountThisIteration = 0;
      }
      else {
        mVar1 = (pConverter->config).channelsOut;
        mVar3 = ma_get_bytes_per_sample((pConverter->config).formatOut);
        frameCountThisIteration = (long)pFramesOut + local_80 * (mVar3 * mVar1);
      }
      if ((pConverter->field_0x2768 & 1) == 0) {
        if (((byte)pConverter->field_0x2768 >> 1 & 1) != 1) {
          __assert_fail("pConverter->hasPostFormatConversion == 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                        ,0x87f8,
                        "ma_result ma_data_converter_process_pcm_frames__channels_only(ma_data_converter *, const void *, ma_uint64 *, void *, ma_uint64 *)"
                       );
        }
        pTempBufferIn._4088_8_ = local_20b8 - local_80;
        if ((ulong)uVar4 < (ulong)pTempBufferIn._4088_8_) {
          pTempBufferIn._4088_8_ = ZEXT48(uVar4);
        }
        iVar6 = ma_channel_converter_process_pcm_frames
                          (&pConverter->channelConverter,local_1088,pFramesOutThisIteration,
                           pTempBufferIn._4088_8_);
      }
      else {
        mVar1 = (pConverter->channelConverter).channelsIn;
        mVar3 = ma_get_bytes_per_sample((pConverter->channelConverter).format);
        uVar5 = SUB164((ZEXT816(0) << 0x40 | ZEXT816(0x1000)) / ZEXT416(mVar3 * mVar1),0);
        pTempBufferIn._4088_8_ = local_20b8 - local_80;
        if ((ulong)uVar5 < (ulong)pTempBufferIn._4088_8_) {
          pTempBufferIn._4088_8_ = ZEXT48(uVar5);
        }
        if ((((byte)pConverter->field_0x2768 >> 1 & 1) != 0) &&
           ((ulong)uVar4 < (ulong)pTempBufferIn._4088_8_)) {
          pTempBufferIn._4088_8_ = ZEXT48(uVar4);
        }
        if (pFramesOutThisIteration == (void *)0x0) {
          memset(local_20a8,0,0x1000);
        }
        else {
          ma_convert_pcm_frames_format
                    (local_20a8,(pConverter->channelConverter).format,pFramesOutThisIteration,
                     (pConverter->config).formatIn,pTempBufferIn._4088_8_,
                     (pConverter->config).channelsIn,(pConverter->config).ditherMode);
        }
        if (((byte)pConverter->field_0x2768 >> 1 & 1) == 0) {
          iVar6 = ma_channel_converter_process_pcm_frames
                            (&pConverter->channelConverter,(void *)frameCountThisIteration,
                             local_20a8,pTempBufferIn._4088_8_);
        }
        else {
          iVar6 = ma_channel_converter_process_pcm_frames
                            (&pConverter->channelConverter,local_1088,local_20a8,
                             pTempBufferIn._4088_8_);
        }
      }
      if (iVar6 != 0) break;
      if ((((byte)pConverter->field_0x2768 >> 1 & 1) != 0) && (frameCountThisIteration != 0)) {
        ma_convert_pcm_frames_format
                  ((void *)frameCountThisIteration,(pConverter->config).formatOut,local_1088,
                   (pConverter->channelConverter).format,pTempBufferIn._4088_8_,
                   (pConverter->channelConverter).channelsOut,(pConverter->config).ditherMode);
      }
    }
  }
  if (pFrameCountIn != (ma_uint64 *)0x0) {
    *pFrameCountIn = local_20b8;
  }
  if (pFrameCountOut != (ma_uint64 *)0x0) {
    *pFrameCountOut = local_20b8;
  }
  return 0;
}

Assistant:

static ma_result ma_data_converter_process_pcm_frames__channels_only(ma_data_converter* pConverter, const void* pFramesIn, ma_uint64* pFrameCountIn, void* pFramesOut, ma_uint64* pFrameCountOut)
{
    ma_result result;
    ma_uint64 frameCountIn;
    ma_uint64 frameCountOut;
    ma_uint64 frameCount;

    MA_ASSERT(pConverter != NULL);

    frameCountIn = 0;
    if (pFrameCountIn != NULL) {
        frameCountIn = *pFrameCountIn;
    }

    frameCountOut = 0;
    if (pFrameCountOut != NULL) {
        frameCountOut = *pFrameCountOut;
    }

    frameCount = ma_min(frameCountIn, frameCountOut);

    if (pConverter->hasPreFormatConversion == MA_FALSE && pConverter->hasPostFormatConversion == MA_FALSE) {
        /* No format conversion required. */
        result = ma_channel_converter_process_pcm_frames(&pConverter->channelConverter, pFramesOut, pFramesIn, frameCount);
        if (result != MA_SUCCESS) {
            return result;
        }
    } else {
        /* Format conversion required. */
        ma_uint64 framesProcessed = 0;

        while (framesProcessed < frameCount) {
            ma_uint8 pTempBufferOut[MA_DATA_CONVERTER_STACK_BUFFER_SIZE];
            const ma_uint32 tempBufferOutCap = sizeof(pTempBufferOut) / ma_get_bytes_per_frame(pConverter->channelConverter.format, pConverter->channelConverter.channelsOut);
            const void* pFramesInThisIteration;
            /* */ void* pFramesOutThisIteration;
            ma_uint64 frameCountThisIteration;

            if (pFramesIn != NULL) {
                pFramesInThisIteration = ma_offset_ptr(pFramesIn, framesProcessed * ma_get_bytes_per_frame(pConverter->config.formatIn, pConverter->config.channelsIn));
            } else {
                pFramesInThisIteration = NULL;
            }

            if (pFramesOut != NULL) {
                pFramesOutThisIteration = ma_offset_ptr(pFramesOut, framesProcessed * ma_get_bytes_per_frame(pConverter->config.formatOut, pConverter->config.channelsOut));
            } else {
                pFramesOutThisIteration = NULL;
            }

            /* Do a pre format conversion if necessary. */
            if (pConverter->hasPreFormatConversion) {
                ma_uint8 pTempBufferIn[MA_DATA_CONVERTER_STACK_BUFFER_SIZE];
                const ma_uint32 tempBufferInCap = sizeof(pTempBufferIn) / ma_get_bytes_per_frame(pConverter->channelConverter.format, pConverter->channelConverter.channelsIn);

                frameCountThisIteration = (frameCount - framesProcessed);
                if (frameCountThisIteration > tempBufferInCap) {
                    frameCountThisIteration = tempBufferInCap;
                }

                if (pConverter->hasPostFormatConversion) {
                    if (frameCountThisIteration > tempBufferOutCap) {
                        frameCountThisIteration = tempBufferOutCap;
                    }
                }

                if (pFramesInThisIteration != NULL) {
                    ma_convert_pcm_frames_format(pTempBufferIn, pConverter->channelConverter.format, pFramesInThisIteration, pConverter->config.formatIn, frameCountThisIteration, pConverter->config.channelsIn, pConverter->config.ditherMode);
                } else {
                    MA_ZERO_MEMORY(pTempBufferIn, sizeof(pTempBufferIn));
                }

                if (pConverter->hasPostFormatConversion) {
                    /* Both input and output conversion required. Output to the temp buffer. */
                    result = ma_channel_converter_process_pcm_frames(&pConverter->channelConverter, pTempBufferOut, pTempBufferIn, frameCountThisIteration);
                } else {
                    /* Only pre-format required. Output straight to the output buffer. */
                    result = ma_channel_converter_process_pcm_frames(&pConverter->channelConverter, pFramesOutThisIteration, pTempBufferIn, frameCountThisIteration);
                }

                if (result != MA_SUCCESS) {
                    break;
                }
            } else {
                /* No pre-format required. Just read straight from the input buffer. */
                MA_ASSERT(pConverter->hasPostFormatConversion == MA_TRUE);

                frameCountThisIteration = (frameCount - framesProcessed);
                if (frameCountThisIteration > tempBufferOutCap) {
                    frameCountThisIteration = tempBufferOutCap;
                }

                result = ma_channel_converter_process_pcm_frames(&pConverter->channelConverter, pTempBufferOut, pFramesInThisIteration, frameCountThisIteration);
                if (result != MA_SUCCESS) {
                    break;
                }
            }

            /* If we are doing a post format conversion we need to do that now. */
            if (pConverter->hasPostFormatConversion) {
                if (pFramesOutThisIteration != NULL) {
                    ma_convert_pcm_frames_format(pFramesOutThisIteration, pConverter->config.formatOut, pTempBufferOut, pConverter->channelConverter.format, frameCountThisIteration, pConverter->channelConverter.channelsOut, pConverter->config.ditherMode);
                }
            }

            framesProcessed += frameCountThisIteration;
        }
    }

    if (pFrameCountIn != NULL) {
        *pFrameCountIn = frameCount;
    }
    if (pFrameCountOut != NULL) {
        *pFrameCountOut = frameCount;
    }

    return MA_SUCCESS;
}